

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86_avx::create_pipeline(Convolution_x86_avx *this,Option *opt)

{
  undefined4 *puVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar15;
  pointer pMVar10;
  int *piVar11;
  void *pvVar12;
  Allocator *pAVar13;
  size_t sVar14;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  bool bVar25;
  bool bVar26;
  byte bVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  int iVar31;
  undefined4 uVar32;
  Layer *pLVar33;
  _func_int **pp_Var34;
  long lVar35;
  long lVar36;
  undefined1 (*pauVar37) [32];
  byte bVar38;
  uint uVar39;
  pointer pMVar40;
  long lVar41;
  ulong uVar42;
  byte bVar43;
  pointer pMVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  ulong uVar50;
  long lVar51;
  undefined1 (*pauVar52) [32];
  int k;
  long lVar53;
  long lVar54;
  uint uVar55;
  undefined1 (*pauVar56) [32];
  uint uVar57;
  _func_int **pp_Var58;
  uint uVar59;
  long lVar60;
  undefined1 (*pauVar61) [16];
  uint uVar62;
  _func_int **pp_Var63;
  _func_int **pp_Var64;
  long lVar65;
  undefined1 (*pauVar66) [16];
  uint uVar67;
  int iVar68;
  long lVar69;
  long lVar70;
  int iVar71;
  ulong uVar72;
  long lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  long local_268;
  long local_238;
  ParamDict pd;
  undefined1 local_218 [8];
  int local_210;
  Allocator *local_208;
  int iStack_200;
  int iStack_1fc;
  size_t sStack_1f8;
  int local_1f0 [2];
  size_t local_1e8;
  void *local_1e0;
  undefined4 uStack_1d8;
  int iStack_1d4;
  size_t local_1d0;
  int local_1c8;
  Allocator *local_1c0;
  undefined4 uStack_1b8;
  int iStack_1b4;
  size_t sStack_1b0;
  int local_1a8;
  size_t local_1a0;
  undefined8 local_198;
  long local_190;
  int TILE_M;
  ParamDict pd_5;
  size_t local_168;
  int local_160;
  Allocator *local_158;
  int local_150;
  int iStack_14c;
  undefined8 uStack_148;
  int local_140;
  size_t local_138;
  long local_130;
  long local_128;
  int TILE_K;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  Mat *local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  int TILE_N;
  
  if ((this->super_Convolution).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_Convolution).activation_type) {
  case 1:
    pLVar33 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 2:
    pLVar33 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 3:
    pLVar33 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 4:
    pLVar33 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 5:
    pLVar33 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  case 6:
    pLVar33 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_Convolution).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_Convolution).activation_params.data + 4));
    (*pLVar33->_vptr_Layer[2])(pLVar33,&pd);
    break;
  default:
    pLVar33 = (Layer *)0x0;
    goto LAB_001f8acf;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar33->_vptr_Layer[4])(pLVar33,opt);
LAB_001f8acf:
  this->activation = pLVar33;
  this->nT = opt->num_threads;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar9 = (this->super_Convolution).kernel_w;
  uVar15 = (this->super_Convolution).kernel_h;
  auVar74._4_4_ = uVar15;
  auVar74._0_4_ = uVar9;
  uVar50 = (long)(this->super_Convolution).weight_data_size / (long)(int)(uVar15 * uVar9);
  uVar7 = (this->super_Convolution).num_output;
  uVar50 = (long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 | uVar50 & 0xffffffff) /
           (long)(int)uVar7;
  if (uVar9 == uVar15 && opt->use_packing_layout == false) {
    auVar16._0_4_ = (this->super_Convolution).dilation_w;
    auVar16._4_4_ = (this->super_Convolution).dilation_h;
    auVar16._8_4_ = (this->super_Convolution).stride_w;
    auVar16._12_4_ = (this->super_Convolution).stride_h;
    auVar17 = vshufps_avx(auVar16,auVar16,0x50);
    auVar79._8_4_ = 1;
    auVar79._0_8_ = 0x100000001;
    auVar79._12_4_ = 1;
    auVar17 = vblendps_avx(auVar79,auVar17,2);
    auVar79 = vpcmpeqd_avx(auVar79,auVar79);
    auVar16 = vpcmpeqd_avx(auVar16,auVar17);
    auVar16 = vpblendw_avx(auVar16,auVar16 ^ auVar79,3);
    auVar79 = auVar79 & ~auVar16;
    if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar79 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar79 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar79[0xf]) {
      pLVar33 = create_layer_cpu(6);
      this->convolution_dilation1 = pLVar33;
      ParamDict::ParamDict(&pd_5);
      ParamDict::set(&pd_5,0,(this->super_Convolution).num_output);
      ParamDict::set(&pd_5,1,(this->super_Convolution).kernel_w);
      ParamDict::set(&pd_5,0xb,(this->super_Convolution).kernel_h);
      ParamDict::set(&pd_5,2,1);
      ParamDict::set(&pd_5,0xc,1);
      ParamDict::set(&pd_5,3,1);
      ParamDict::set(&pd_5,0xd,1);
      ParamDict::set(&pd_5,4,0);
      ParamDict::set(&pd_5,0xe,0);
      ParamDict::set(&pd_5,5,(this->super_Convolution).bias_term);
      ParamDict::set(&pd_5,6,(this->super_Convolution).weight_data_size);
      (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
      if ((this->super_Convolution).bias_term == 0) {
        local_1e8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        local_218 = SUB128(ZEXT812(0),4);
        local_210 = 0;
        local_208 = (Allocator *)0x0;
        iStack_200 = 0;
        local_1f0[0] = 0;
        iStack_1fc = pd.d._4_4_;
        sStack_1f8 = (size_t)local_218;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar11 = (this->super_Convolution).weight_data.refcount;
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar11 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar11,0);
          pd.d._4_4_ = (int)((ulong)piVar11 >> 0x20);
          local_218 = (undefined1  [8])(this->super_Convolution).weight_data.elemsize;
          local_210 = (this->super_Convolution).weight_data.elempack;
          local_208 = (this->super_Convolution).weight_data.allocator;
          uVar23 = (this->super_Convolution).weight_data.dims;
          uVar24 = (this->super_Convolution).weight_data.w;
          sStack_1f8._0_4_ = (this->super_Convolution).weight_data.h;
          sStack_1f8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1f0[0] = (this->super_Convolution).weight_data.c;
          local_1e8 = (this->super_Convolution).weight_data.cstep;
          iStack_200 = uVar23;
          iStack_1fc = uVar24;
        }
        pLVar33 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        piVar11 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_208 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_208->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        local_1e8 = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        iStack_1d4 = 0;
        local_218 = SUB128(ZEXT812(0),4);
        local_1d0 = (size_t)local_218;
        local_210 = 0;
        local_208 = (Allocator *)0x0;
        iStack_200 = 0;
        local_1f0[0] = 0;
        local_1a0 = 0;
        local_1e0 = (void *)0x0;
        uStack_1d8 = 0;
        local_1c8 = 0;
        local_1c0 = (Allocator *)0x0;
        uStack_1b8 = 0;
        local_1a8 = 0;
        pd.d._4_4_ = iStack_1d4;
        iStack_1fc = iStack_1d4;
        sStack_1f8 = (size_t)local_218;
        if ((Mat *)&pd != &(this->super_Convolution).weight_data) {
          piVar11 = (this->super_Convolution).weight_data.refcount;
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + 1;
            UNLOCK();
          }
          pd._vptr_ParamDict = (_func_int **)(this->super_Convolution).weight_data.data;
          piVar11 = (this->super_Convolution).weight_data.refcount;
          pd.d._0_4_ = SUB84(piVar11,0);
          pd.d._4_4_ = (int)((ulong)piVar11 >> 0x20);
          local_218 = (undefined1  [8])(this->super_Convolution).weight_data.elemsize;
          local_210 = (this->super_Convolution).weight_data.elempack;
          local_208 = (this->super_Convolution).weight_data.allocator;
          uVar19 = (this->super_Convolution).weight_data.dims;
          uVar20 = (this->super_Convolution).weight_data.w;
          sStack_1f8._0_4_ = (this->super_Convolution).weight_data.h;
          sStack_1f8._4_4_ = (this->super_Convolution).weight_data.d;
          local_1f0[0] = (this->super_Convolution).weight_data.c;
          local_1e8 = (this->super_Convolution).weight_data.cstep;
          iStack_200 = uVar19;
          iStack_1fc = uVar20;
        }
        iStack_1b4 = iStack_1d4;
        sStack_1b0 = local_1d0;
        if ((Mat *)&local_1e0 != &(this->super_Convolution).bias_data) {
          piVar11 = (this->super_Convolution).bias_data.refcount;
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + 1;
            UNLOCK();
          }
          local_1e0 = (this->super_Convolution).bias_data.data;
          piVar11 = (this->super_Convolution).bias_data.refcount;
          uStack_1d8 = SUB84(piVar11,0);
          iStack_1d4 = (int)((ulong)piVar11 >> 0x20);
          local_1d0 = (this->super_Convolution).bias_data.elemsize;
          local_1c8 = (this->super_Convolution).bias_data.elempack;
          local_1c0 = (this->super_Convolution).bias_data.allocator;
          uVar21 = (this->super_Convolution).bias_data.dims;
          uVar22 = (this->super_Convolution).bias_data.w;
          sStack_1b0._0_4_ = (this->super_Convolution).bias_data.h;
          sStack_1b0._4_4_ = (this->super_Convolution).bias_data.d;
          local_1a8 = (this->super_Convolution).bias_data.c;
          local_1a0 = (this->super_Convolution).bias_data.cstep;
          uStack_1b8 = uVar21;
          iStack_1b4 = uVar22;
        }
        pLVar33 = this->convolution_dilation1;
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M,(Mat *)&pd);
        (*pLVar33->_vptr_Layer[3])(pLVar33,&TILE_M);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&TILE_M);
        lVar51 = 0x48;
        do {
          piVar11 = *(int **)((long)&pd.d + lVar51);
          if (piVar11 != (int *)0x0) {
            LOCK();
            *piVar11 = *piVar11 + -1;
            UNLOCK();
            if (*piVar11 == 0) {
              pvVar12 = *(void **)((long)&pd._vptr_ParamDict + lVar51);
              if (*(long **)((long)&local_208 + lVar51) == (long *)0x0) {
                if (pvVar12 != (void *)0x0) {
                  free(pvVar12);
                }
              }
              else {
                (**(code **)(**(long **)((long)&local_208 + lVar51) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1e8 + lVar51) = 0;
          *(undefined8 *)((long)&pd.d + lVar51 + 4) = 0;
          *(undefined8 *)(local_218 + lVar51 + 4) = 0;
          *(undefined8 *)((long)&pd._vptr_ParamDict + lVar51) = 0;
          *(undefined8 *)((long)&pd.d + lVar51) = 0;
          *(undefined8 *)((long)&iStack_200 + lVar51) = 0;
          *(undefined8 *)((long)local_1f0 + lVar51 + -8) = 0;
          *(undefined4 *)((long)local_1f0 + lVar51) = 0;
          lVar51 = lVar51 + -0x48;
        } while (lVar51 != -0x48);
      }
      (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
      if (opt->lightmode == true) {
        piVar11 = (this->super_Convolution).weight_data.refcount;
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            pvVar12 = (this->super_Convolution).weight_data.data;
            pAVar13 = (this->super_Convolution).weight_data.allocator;
            if (pAVar13 == (Allocator *)0x0) {
              if (pvVar12 != (void *)0x0) {
                free(pvVar12);
              }
            }
            else {
              (*pAVar13->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Convolution).weight_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Convolution).weight_data.elemsize + 4) = 0;
        (this->super_Convolution).weight_data.data = (void *)0x0;
        (this->super_Convolution).weight_data.refcount = (int *)0x0;
        (this->super_Convolution).weight_data.dims = 0;
        (this->super_Convolution).weight_data.w = 0;
        (this->super_Convolution).weight_data.h = 0;
        (this->super_Convolution).weight_data.d = 0;
        (this->super_Convolution).weight_data.c = 0;
      }
      ParamDict::~ParamDict(&pd_5);
      return 0;
    }
  }
  uVar29 = 1;
  uVar55 = 1;
  if (opt->use_packing_layout != false) {
    uVar29 = (uint)((uVar50 & 3) == 0) * 3 + 1;
    if ((uVar50 & 7) == 0) {
      uVar29 = 8;
    }
    uVar55 = (uint)((uVar7 & 3) == 0) * 3 + 1;
    if ((uVar7 & 7) == 0) {
      uVar55 = 8;
    }
  }
  bVar43 = opt->use_winograd23_convolution;
  iVar31 = (int)uVar50;
  if ((((bool)bVar43 == false) && (opt->use_winograd43_convolution == false)) &&
     (opt->use_winograd63_convolution != true)) {
    bVar25 = false;
  }
  else {
    bVar25 = 8 < (int)uVar7 || 8 < iVar31;
  }
  auVar17._0_4_ = (this->super_Convolution).dilation_w;
  auVar17._4_4_ = (this->super_Convolution).dilation_h;
  auVar17._8_4_ = (this->super_Convolution).stride_w;
  auVar17._12_4_ = (this->super_Convolution).stride_h;
  auVar74._8_8_ = 0;
  auVar74 = vpunpcklqdq_avx(auVar74,auVar17);
  if (((auVar74 != _DAT_005a5480) || ((this->super_Convolution).stride_w != 1)) ||
     (((this->super_Convolution).stride_h != 1 ||
      ((opt->use_winograd_convolution == false || (!bVar25)))))) {
    iVar28 = get_cpu_level2_cache_size();
    uVar7 = (this->super_Convolution).num_output;
    uVar57 = (this->super_Convolution).kernel_w;
    uVar67 = (this->super_Convolution).kernel_h;
    uVar30 = (this->super_Convolution).dilation_w;
    uVar39 = (this->super_Convolution).dilation_h;
    iVar68 = (this->super_Convolution).stride_w;
    iVar71 = (this->super_Convolution).stride_h;
    if (((opt->use_sgemm_convolution == true) &&
        (iVar28 < (int)(uVar7 * uVar57 * uVar67 * uVar30 * uVar39 * iVar68 * iVar71 * iVar31 * 8) ||
         (0x10 < iVar31 || 0x10 < (int)uVar7))) || (uVar67 == 1 && uVar57 == 1)) {
      uVar67 = uVar67 * uVar57;
      iVar68 = uVar67 * iVar31;
      convolution_im2col_gemm_get_optimal_tile_mnk
                (uVar7,0,iVar68,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      uVar29 = (int)(TILE_M + uVar7 + -1) / TILE_M;
      local_268 = 1;
      if (opt->use_packing_layout == true) {
        local_268 = 8;
        if ((uVar50 & 7) != 0) {
          local_268 = (ulong)((uVar50 & 3) == 0) * 3 + 1;
        }
      }
      local_80 = &(this->super_Convolution).weight_data;
      local_1e8 = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_218 = (undefined1  [8])0x0;
      local_210 = 0;
      local_208 = (Allocator *)0x0;
      iStack_200 = 0;
      iStack_1fc = 0;
      sStack_1f8._0_4_ = 0;
      sStack_1f8._4_4_ = 0;
      local_1f0[0] = 0;
      if (uVar67 == 1) {
        Mat::reshape((Mat *)&pd_5,local_80,iVar68,uVar7,(Allocator *)0x0);
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + 1;
          UNLOCK();
        }
        piVar11 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        if (piVar11 != (int *)0x0) {
          LOCK();
          *piVar11 = *piVar11 + -1;
          UNLOCK();
          if (*piVar11 == 0) {
            if (local_208 == (Allocator *)0x0) {
              if (pd._vptr_ParamDict != (_func_int **)0x0) {
                free(pd._vptr_ParamDict);
              }
            }
            else {
              (*local_208->_vptr_Allocator[3])();
            }
          }
        }
        pd._vptr_ParamDict = pd_5._vptr_ParamDict;
        pd.d._0_4_ = SUB84(pd_5.d,0);
        pd.d._4_4_ = (int)((ulong)pd_5.d >> 0x20);
        local_218 = (undefined1  [8])local_168;
        local_210 = local_160;
        local_208 = local_158;
        iStack_200 = local_150;
        iStack_1fc = iStack_14c;
        sStack_1f8 = uStack_148;
        local_1f0[0] = local_140;
        local_1e8 = local_138;
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
          UNLOCK();
          if ((pd_5.d)->params[0].type == 0) {
            if (local_158 == (Allocator *)0x0) {
joined_r0x001f96ba:
              if (pd_5._vptr_ParamDict != (_func_int **)0x0) {
                free(pd_5._vptr_ParamDict);
              }
            }
            else {
              (*local_158->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        Mat::reshape((Mat *)&pd_5,local_80,uVar67,iVar31,uVar7,(Allocator *)0x0);
        Mat::create((Mat *)&pd,iVar68,uVar7,4,(Allocator *)0x0);
        if (0 < (int)uVar7) {
          uVar50 = 0;
          do {
            if ((int)local_268 <= iVar31) {
              pp_Var34 = (_func_int **)(local_168 * local_138 * uVar50 + (long)pd_5._vptr_ParamDict)
              ;
              pp_Var58 = (_func_int **)
                         ((long)iStack_1fc * (long)local_218 * uVar50 + (long)pd._vptr_ParamDict);
              lVar51 = 0;
              do {
                if (0 < (int)uVar67) {
                  uVar42 = 0;
                  lVar35 = local_268;
                  pp_Var64 = pp_Var34;
                  pp_Var63 = pp_Var34;
                  do {
                    do {
                      *(undefined4 *)pp_Var58 = *(undefined4 *)pp_Var64;
                      pp_Var58 = (_func_int **)((long)pp_Var58 + 4);
                      lVar35 = lVar35 + -1;
                      pp_Var64 = (_func_int **)((long)pp_Var64 + (long)iStack_14c * local_168);
                    } while (lVar35 != 0);
                    uVar42 = uVar42 + 1;
                    pp_Var64 = (_func_int **)((long)pp_Var63 + 4);
                    lVar35 = local_268;
                    pp_Var63 = pp_Var64;
                  } while (uVar42 != uVar67);
                }
                lVar51 = lVar51 + local_268;
                pp_Var34 = (_func_int **)((long)pp_Var34 + (long)iStack_14c * local_168 * local_268)
                ;
              } while (lVar51 < (long)((long)iVar31 - (ulong)((int)local_268 - 1)));
            }
            uVar50 = uVar50 + 1;
          } while (uVar50 != uVar7);
        }
        if (pd_5.d != (ParamDictPrivate *)0x0) {
          LOCK();
          (pd_5.d)->params[0].type = (pd_5.d)->params[0].type + -1;
          UNLOCK();
          if ((pd_5.d)->params[0].type == 0) {
            if (local_158 == (Allocator *)0x0) goto joined_r0x001f96ba;
            (*local_158->_vptr_Allocator[3])();
          }
        }
      }
      lVar51 = (long)TILE_M;
      Mat::create(&this->weight_sgemm_data,TILE_M * TILE_K,(iVar68 + TILE_K + -1) / TILE_K,
                  (int)((uVar7 - 1) + TILE_M) / TILE_M,4,(Allocator *)0x0);
      if (0 < (int)uVar29) {
        local_58 = (long)iVar68;
        local_60 = (long)TILE_K * 4;
        local_78 = lVar51 * 4;
        local_b0 = 4;
        local_b8 = 8;
        local_c0 = 0xc;
        local_c8 = 0x10;
        local_d0 = 0x14;
        local_d8 = 0x18;
        local_e0 = 0x1c;
        local_e8 = 3;
        local_f0 = 2;
        local_128 = 1;
        local_130 = 0;
        local_f8 = 0;
        uVar50 = 0;
        do {
          lVar35 = uVar50 * lVar51;
          uVar55 = uVar7 - (int)lVar35;
          if (TILE_M < (int)uVar55) {
            uVar55 = TILE_M;
          }
          if (0 < iVar68) {
            local_48 = (ulong)uVar55;
            lVar36 = (long)(int)uVar55;
            local_238 = 0;
            uVar42 = 0;
            iVar31 = iVar68;
            do {
              iVar71 = iVar31;
              if (TILE_K < iVar31) {
                iVar71 = TILE_K;
              }
              uVar57 = iVar68 - (int)uVar42;
              if (TILE_K < (int)uVar57) {
                uVar57 = TILE_K;
              }
              sVar14 = (this->weight_sgemm_data).elemsize;
              pauVar52 = (undefined1 (*) [32])
                         ((long)(this->weight_sgemm_data).data +
                         (long)(this->weight_sgemm_data).w * sVar14 *
                         (long)(int)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                                           uVar42 & 0xffffffff) / (long)TILE_K) +
                         (this->weight_sgemm_data).cstep * uVar50 * sVar14);
              uVar72 = 0;
              lVar69 = (long)iStack_1fc;
              if (7 < (int)uVar55) {
                lVar45 = local_f8 * lVar69 + local_238;
                local_40 = lVar69 * 0x20;
                lVar53 = local_b8 * lVar69 + local_238;
                local_88 = local_c0 * lVar69 + local_238;
                local_90 = local_c8 * lVar69 + local_238;
                local_98 = local_d0 * lVar69 + local_238;
                local_a0 = local_d8 * lVar69 + local_238;
                local_a8 = local_e0 * lVar69 + local_238;
                uVar72 = 0;
                lVar60 = local_b0 * lVar69 + local_238;
                do {
                  local_190 = lVar60;
                  local_198 = uVar72;
                  if ((int)uVar57 < 8) {
                    lVar60 = uVar42 * 4 + (local_198 + lVar35) * lVar69 * 4;
                    lVar41 = uVar42 * 4 + (local_198 + lVar35 + 1) * lVar69 * 4;
                    lVar65 = uVar42 * 4 + (local_198 + lVar35 + 2) * lVar69 * 4;
                    lVar70 = uVar42 * 4 + (local_198 + lVar35 + 3) * lVar69 * 4;
                    lVar73 = uVar42 * 4 + (local_198 + lVar35 + 4) * lVar69 * 4;
                    lVar48 = uVar42 * 4 + (local_198 + lVar35 + 5) * lVar69 * 4;
                    lVar54 = uVar42 * 4 + (local_198 + lVar35 + 6) * lVar69 * 4;
                    lVar46 = uVar42 * 4 + (lVar35 + local_198 + 7) * lVar69 * 4;
                    uVar67 = 0;
                  }
                  else {
                    iVar28 = 7;
                    lVar46 = 0;
                    pauVar56 = pauVar52;
                    do {
                      pauVar37 = pauVar56;
                      pauVar56 = (undefined1 (*) [32])((long)*pauVar52 + lVar46 * 2 * 4);
                      lVar60 = lVar46 + lVar45;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar46 + lVar45);
                      lVar41 = lVar69 * 8 + lVar60;
                      auVar78 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + lVar69 * 4 + lVar60);
                      auVar80 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + lVar69 * 8 + lVar60);
                      auVar3 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar69 * 4 + lVar41);
                      lVar60 = lVar69 * 8 + lVar41;
                      auVar4 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar69 * 8 + lVar41);
                      lVar41 = lVar69 * 4 + lVar60;
                      auVar81 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + lVar69 * 4 + lVar60);
                      auVar5 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar69 * 4 + lVar41);
                      auVar6 = *(undefined1 (*) [32])
                                ((long)pd._vptr_ParamDict + lVar69 * 8 + lVar41);
                      auVar18 = vunpcklps_avx(auVar2,auVar78);
                      auVar78 = vunpckhps_avx(auVar2,auVar78);
                      auVar2 = vunpcklps_avx(auVar80,auVar3);
                      auVar80 = vunpckhps_avx(auVar80,auVar3);
                      auVar82 = vunpcklps_avx(auVar4,auVar81);
                      auVar3 = vunpckhps_avx(auVar4,auVar81);
                      auVar83 = vunpcklps_avx(auVar5,auVar6);
                      auVar4 = vunpckhps_avx(auVar5,auVar6);
                      auVar81 = vunpcklpd_avx(auVar18,auVar2);
                      auVar2 = vunpckhpd_avx(auVar18,auVar2);
                      auVar5 = vunpcklpd_avx(auVar78,auVar80);
                      auVar78 = vunpckhpd_avx(auVar78,auVar80);
                      auVar6 = vunpcklpd_avx(auVar82,auVar83);
                      auVar80 = vunpckhpd_avx(auVar82,auVar83);
                      auVar18 = vunpcklpd_avx(auVar3,auVar4);
                      auVar3 = vunpckhpd_avx(auVar3,auVar4);
                      auVar82._16_16_ = auVar6._0_16_;
                      auVar82._0_16_ = auVar81._0_16_;
                      auVar83._16_16_ = auVar80._0_16_;
                      auVar83._0_16_ = auVar2._0_16_;
                      auVar84._16_16_ = auVar18._0_16_;
                      auVar84._0_16_ = auVar5._0_16_;
                      auVar85._16_16_ = auVar3._0_16_;
                      auVar85._0_16_ = auVar78._0_16_;
                      auVar4 = vperm2f128_avx(auVar81,auVar6,0x31);
                      auVar2 = vperm2f128_avx(auVar2,auVar80,0x31);
                      auVar80 = vperm2f128_avx(auVar5,auVar18,0x31);
                      auVar78 = vperm2f128_avx(auVar78,auVar3,0x31);
                      *pauVar56 = auVar82;
                      pauVar56[1] = auVar83;
                      pauVar56[2] = auVar84;
                      pauVar56[3] = auVar85;
                      pauVar56[4] = auVar4;
                      pauVar56[5] = auVar2;
                      pauVar56[6] = auVar80;
                      pauVar56[7] = auVar78;
                      lVar46 = lVar46 + 0x20;
                      iVar28 = iVar28 + 8;
                      pauVar56 = pauVar56 + 8;
                    } while (iVar28 < (int)uVar57);
                    pauVar52 = pauVar37 + 8;
                    lVar60 = lVar46 + lVar45;
                    lVar41 = lVar46 + local_190;
                    lVar65 = lVar46 + lVar53;
                    lVar70 = lVar46 + local_88;
                    lVar73 = lVar46 + local_90;
                    lVar48 = lVar46 + local_98;
                    lVar54 = lVar46 + local_a0;
                    lVar46 = lVar46 + local_a8;
                    uVar67 = uVar57 & 0xfffffff8;
                  }
                  if ((int)uVar67 < (int)uVar57) {
                    iVar28 = iVar71 - uVar67;
                    lVar47 = 0;
                    pauVar56 = pauVar52;
                    do {
                      pauVar37 = pauVar56;
                      puVar1 = (undefined4 *)((long)*pauVar52 + lVar47 * 2 * 4);
                      *puVar1 = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar60);
                      puVar1[1] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar41);
                      puVar1[2] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar65);
                      puVar1[3] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar70);
                      puVar1[4] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar73);
                      puVar1[5] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar48);
                      puVar1[6] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar54);
                      puVar1[7] = *(undefined4 *)((long)pd._vptr_ParamDict + lVar47 + lVar46);
                      lVar47 = lVar47 + 4;
                      iVar28 = iVar28 + -1;
                      pauVar56 = (undefined1 (*) [32])(puVar1 + 8);
                    } while (iVar28 != 0);
                    pauVar52 = pauVar37 + 1;
                  }
                  uVar72 = local_198 + 8;
                  lVar45 = lVar45 + local_40;
                  lVar53 = lVar53 + local_40;
                  local_88 = local_88 + local_40;
                  local_90 = local_90 + local_40;
                  local_98 = local_98 + local_40;
                  local_a0 = local_a0 + local_40;
                  local_a8 = local_a8 + local_40;
                  lVar60 = local_190 + local_40;
                } while (local_198 + 0xf < local_48);
              }
              if ((int)((uint)uVar72 | 3) < (int)uVar55) {
                local_198 = CONCAT44(local_198._4_4_,uVar57) & 0xfffffffffffffff8;
                uVar49 = uVar72 & 0xffffffff;
                lVar60 = local_238 + (local_130 + uVar49) * lVar69 * 4;
                lVar65 = lVar69 * 0x10;
                lVar45 = local_238 + (local_e8 + uVar49) * lVar69 * 4;
                lVar53 = local_238 + (local_f0 + uVar49) * lVar69 * 4;
                lVar41 = local_238 + (local_128 + uVar49) * lVar69 * 4;
                do {
                  local_190 = lVar41;
                  if ((int)uVar57 < 8) {
                    uVar67 = 0;
                    lVar41 = uVar42 * 4 + (uVar49 + lVar35) * lVar69 * 4;
                    lVar48 = uVar42 * 4 + (uVar49 + lVar35 + 1) * lVar69 * 4;
                    lVar73 = uVar42 * 4 + (uVar49 + lVar35 + 2) * lVar69 * 4;
                    lVar70 = uVar42 * 4 + (uVar49 + lVar35 + 3) * lVar69 * 4;
                  }
                  else {
                    iVar28 = 7;
                    lVar48 = 0;
                    pauVar56 = pauVar52;
                    do {
                      pauVar37 = pauVar56;
                      pauVar56 = (undefined1 (*) [32])((long)*pauVar52 + lVar48 * 4);
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar48 + lVar60);
                      auVar78 = *(undefined1 (*) [32])
                                 ((long)pd._vptr_ParamDict + lVar48 + local_190);
                      auVar80 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar48 + lVar53);
                      auVar3 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar48 + lVar45);
                      auVar4 = vunpcklps_avx(auVar2,auVar78);
                      auVar78 = vunpckhps_avx(auVar2,auVar78);
                      auVar2 = vunpcklps_avx(auVar80,auVar3);
                      auVar80 = vunpckhps_avx(auVar80,auVar3);
                      auVar3 = vunpcklpd_avx(auVar4,auVar2);
                      auVar2 = vunpckhpd_avx(auVar4,auVar2);
                      auVar4 = vunpcklpd_avx(auVar78,auVar80);
                      auVar78 = vunpckhpd_avx(auVar78,auVar80);
                      auVar80._16_16_ = auVar2._0_16_;
                      auVar80._0_16_ = auVar3._0_16_;
                      auVar81._16_16_ = auVar78._0_16_;
                      auVar81._0_16_ = auVar4._0_16_;
                      auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
                      auVar78 = vperm2f128_avx(auVar4,auVar78,0x31);
                      *pauVar56 = auVar80;
                      pauVar56[1] = auVar81;
                      pauVar56[2] = auVar2;
                      pauVar56[3] = auVar78;
                      lVar48 = lVar48 + 0x20;
                      iVar28 = iVar28 + 8;
                      pauVar56 = pauVar56 + 4;
                    } while (iVar28 < (int)uVar57);
                    pauVar52 = pauVar37 + 4;
                    lVar41 = lVar48 + lVar60;
                    lVar70 = lVar48 + lVar45;
                    lVar73 = lVar48 + lVar53;
                    lVar48 = lVar48 + local_190;
                    uVar67 = (uint)local_198;
                  }
                  lVar73 = (long)pd._vptr_ParamDict + lVar73;
                  lVar48 = (long)pd._vptr_ParamDict + lVar48;
                  lVar70 = (long)pd._vptr_ParamDict + lVar70;
                  lVar41 = (long)pd._vptr_ParamDict + lVar41;
                  if ((int)(uVar67 | 3) < (int)uVar57) {
                    lVar54 = 0;
                    pauVar56 = pauVar52;
                    uVar30 = uVar67;
                    do {
                      pauVar37 = pauVar56;
                      auVar16 = vunpcklps_avx(*(undefined1 (*) [16])(lVar41 + lVar54),
                                              *(undefined1 (*) [16])(lVar48 + lVar54));
                      auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(lVar73 + lVar54),
                                              *(undefined1 (*) [16])(lVar70 + lVar54));
                      auVar79 = vunpckhps_avx(*(undefined1 (*) [16])(lVar41 + lVar54),
                                              *(undefined1 (*) [16])(lVar48 + lVar54));
                      auVar75 = vunpckhps_avx(*(undefined1 (*) [16])(lVar73 + lVar54),
                                              *(undefined1 (*) [16])(lVar70 + lVar54));
                      auVar74 = vmovlhps_avx(auVar16,auVar17);
                      auVar17 = vunpckhpd_avx(auVar16,auVar17);
                      auVar16 = vmovlhps_avx(auVar79,auVar75);
                      auVar79 = vunpckhpd_avx(auVar79,auVar75);
                      pauVar56 = (undefined1 (*) [32])((long)pauVar52[2] + lVar54 * 4);
                      *(undefined1 (*) [16])pauVar56[-2] = auVar74;
                      *(undefined1 (*) [16])((long)pauVar56[-2] + 0x10) = auVar17;
                      *(undefined1 (*) [16])pauVar56[-1] = auVar16;
                      *(undefined1 (*) [16])((long)pauVar56[-1] + 0x10) = auVar79;
                      uVar67 = uVar30 + 4;
                      lVar54 = lVar54 + 0x10;
                      iVar28 = uVar30 + 7;
                      uVar30 = uVar67;
                    } while (iVar28 < (int)uVar57);
                    pauVar52 = pauVar37 + 2;
                    lVar41 = lVar41 + lVar54;
                    lVar70 = lVar70 + lVar54;
                    lVar73 = lVar73 + lVar54;
                    lVar48 = lVar48 + lVar54;
                  }
                  if ((int)uVar67 < (int)uVar57) {
                    lVar54 = 0;
                    do {
                      *(undefined4 *)*pauVar52 = *(undefined4 *)(lVar41 + lVar54 * 4);
                      *(undefined4 *)((long)*pauVar52 + 4) = *(undefined4 *)(lVar48 + lVar54 * 4);
                      *(undefined4 *)((long)*pauVar52 + 8) = *(undefined4 *)(lVar73 + lVar54 * 4);
                      *(undefined4 *)((long)*pauVar52 + 0xc) = *(undefined4 *)(lVar70 + lVar54 * 4);
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar52 + 0x10);
                      lVar54 = lVar54 + 1;
                    } while (iVar71 - uVar67 != (int)lVar54);
                  }
                  uVar72 = uVar49 + 4;
                  lVar70 = uVar49 + 7;
                  lVar60 = lVar60 + lVar65;
                  lVar45 = lVar45 + lVar65;
                  lVar53 = lVar53 + lVar65;
                  lVar41 = local_190 + lVar65;
                  uVar49 = uVar72;
                } while (lVar70 < lVar36);
              }
              if ((int)((uint)uVar72 | 1) < (int)uVar55) {
                uVar49 = uVar72 & 0xffffffff;
                lVar60 = local_238 + (local_128 + uVar49) * lVar69 * 4;
                lVar45 = local_238 + (local_130 + uVar49) * lVar69 * 4;
                do {
                  if ((int)uVar57 < 8) {
                    uVar67 = 0;
                    lVar41 = uVar42 * 4 + (uVar49 + lVar35) * lVar69 * 4;
                    lVar53 = uVar42 * 4 + (lVar35 + uVar49 + 1) * lVar69 * 4;
                  }
                  else {
                    iVar28 = 7;
                    lVar41 = 0;
                    pauVar56 = pauVar52;
                    do {
                      pauVar37 = pauVar56;
                      auVar2 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar41 + lVar45);
                      auVar78 = *(undefined1 (*) [32])((long)pd._vptr_ParamDict + lVar41 + lVar60);
                      auVar80 = vunpcklps_avx(auVar2,auVar78);
                      auVar2 = vunpckhps_avx(auVar2,auVar78);
                      auVar78._16_16_ = auVar2._0_16_;
                      auVar78._0_16_ = auVar80._0_16_;
                      auVar2 = vperm2f128_avx(auVar80,auVar2,0x31);
                      pauVar56 = (undefined1 (*) [32])((long)*pauVar52 + lVar41 * 2);
                      *pauVar56 = auVar78;
                      pauVar56[1] = auVar2;
                      lVar41 = lVar41 + 0x20;
                      iVar28 = iVar28 + 8;
                      pauVar56 = pauVar56 + 2;
                    } while (iVar28 < (int)uVar57);
                    pauVar52 = pauVar37 + 2;
                    lVar53 = lVar41 + lVar60;
                    lVar41 = lVar41 + lVar45;
                    uVar67 = uVar57 & 0xfffffff8;
                  }
                  pauVar66 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar41);
                  pauVar61 = (undefined1 (*) [16])((long)pd._vptr_ParamDict + lVar53);
                  uVar30 = uVar67 | 3;
                  while ((int)uVar30 < (int)uVar57) {
                    auVar16 = vunpcklps_avx(*pauVar66,*pauVar61);
                    auVar74 = vunpckhps_avx(*pauVar66,*pauVar61);
                    *(undefined1 (*) [16])*pauVar52 = auVar16;
                    *(undefined1 (*) [16])((long)*pauVar52 + 0x10) = auVar74;
                    pauVar52 = pauVar52 + 1;
                    pauVar66 = pauVar66 + 1;
                    pauVar61 = pauVar61 + 1;
                    uVar30 = uVar67 + 7;
                    uVar67 = uVar67 + 4;
                  }
                  if ((int)uVar67 < (int)uVar57) {
                    lVar53 = 0;
                    do {
                      *(undefined4 *)*pauVar52 = *(undefined4 *)(*pauVar66 + lVar53 * 4);
                      *(undefined4 *)((long)*pauVar52 + 4) = *(undefined4 *)(*pauVar61 + lVar53 * 4)
                      ;
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar52 + 8);
                      lVar53 = lVar53 + 1;
                    } while (iVar71 - uVar67 != (int)lVar53);
                  }
                  uVar72 = uVar49 + 2;
                  lVar53 = uVar49 + 3;
                  lVar60 = lVar60 + lVar69 * 8;
                  lVar45 = lVar45 + lVar69 * 8;
                  uVar49 = uVar72;
                } while (lVar53 < lVar36);
              }
              if ((int)uVar72 < (int)uVar55) {
                lVar60 = (long)(int)uVar72;
                do {
                  pauVar56 = (undefined1 (*) [32])
                             ((long)pd._vptr_ParamDict + uVar42 * 4 + (lVar35 + lVar60) * lVar69 * 4
                             );
                  uVar67 = 0;
                  if (7 < (int)uVar57) {
                    iVar28 = 7;
                    do {
                      *pauVar52 = *pauVar56;
                      pauVar52 = pauVar52 + 1;
                      pauVar56 = pauVar56 + 1;
                      iVar28 = iVar28 + 8;
                      uVar67 = uVar57 & 0xfffffff8;
                    } while (iVar28 < (int)uVar57);
                  }
                  uVar30 = uVar67 | 3;
                  while ((int)uVar30 < (int)uVar57) {
                    *(undefined1 (*) [16])*pauVar52 = *(undefined1 (*) [16])*pauVar56;
                    pauVar52 = (undefined1 (*) [32])((long)*pauVar52 + 0x10);
                    pauVar56 = (undefined1 (*) [32])(*pauVar56 + 0x10);
                    uVar30 = uVar67 + 7;
                    uVar67 = uVar67 + 4;
                  }
                  if ((int)uVar67 < (int)uVar57) {
                    lVar45 = 0;
                    do {
                      *(undefined4 *)*pauVar52 = *(undefined4 *)(*pauVar56 + lVar45 * 4);
                      pauVar52 = (undefined1 (*) [32])((long)*pauVar52 + 4);
                      lVar45 = lVar45 + 1;
                    } while (iVar71 - uVar67 != (int)lVar45);
                  }
                  lVar60 = lVar60 + 1;
                } while (lVar60 != lVar36);
              }
              uVar42 = uVar42 + (long)TILE_K;
              local_238 = local_238 + local_60;
              iVar31 = iVar31 - TILE_K;
              local_50 = uVar50;
            } while ((long)uVar42 < local_58);
          }
          uVar50 = uVar50 + 1;
          local_f8 = local_f8 + local_78;
          local_b0 = local_b0 + local_78;
          local_b8 = local_b8 + local_78;
          local_c0 = local_c0 + local_78;
          local_c8 = local_c8 + local_78;
          local_d0 = local_d0 + local_78;
          local_d8 = local_d8 + local_78;
          local_e0 = local_e0 + local_78;
          local_130 = local_130 + lVar51;
          local_e8 = local_e8 + lVar51;
          local_f0 = local_f0 + lVar51;
          local_128 = local_128 + lVar51;
          local_70 = (ulong)uVar29;
          local_68 = lVar51;
        } while (uVar50 != uVar29);
      }
      piVar11 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_208 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_208->_vptr_Allocator[3])();
          }
        }
      }
      if (opt->lightmode != true) {
        return 0;
      }
      piVar11 = (this->super_Convolution).weight_data.refcount;
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          pvVar12 = (this->super_Convolution).weight_data.data;
          pAVar13 = (this->super_Convolution).weight_data.allocator;
          if (pAVar13 == (Allocator *)0x0) {
            if (pvVar12 != (void *)0x0) {
              free(pvVar12);
            }
          }
          else {
            (*pAVar13->_vptr_Allocator[3])();
          }
        }
      }
      (this->super_Convolution).weight_data.cstep = 0;
      *(undefined1 (*) [16])((long)&local_80->refcount + 4) = (undefined1  [16])0x0;
      local_80->data = (void *)0x0;
      local_80->refcount = (int *)0x0;
      goto LAB_001fa6a3;
    }
    bVar25 = (uVar29 ^ 8) == 0 && (uVar55 ^ 8) == 0;
    if ((((iVar68 == 1 && uVar39 == 1) && ((uVar30 == 1 && uVar67 == 3) && (uVar57 == 3 && bVar25)))
         && iVar71 == 1) ||
       (iVar71 == 1 &&
        ((uVar39 == 1 && iVar68 == 1) && ((uVar67 == 2 && uVar30 == 1) && (bVar25 && uVar57 == 2))))
       ) {
LAB_001f93fd:
      convolution_transform_kernel_packed_sse
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar31,uVar7,uVar57,
                 uVar67,uVar29,uVar55);
    }
    else {
      uVar39 = uVar39 ^ 1;
      uVar30 = uVar30 ^ 1;
      uVar59 = uVar67 ^ 3;
      uVar62 = uVar57 ^ 3;
      bVar25 = ((((uVar55 ^ 8) == 0 && (uVar29 ^ 1) == 0) && uVar62 == 0) &&
               (uVar59 == 0 && uVar30 == 0)) && uVar39 == 0;
      if (((iVar68 == 1 && bVar25) && iVar71 == 1) ||
         (((bVar25 && iVar68 == 2) && iVar71 == 2 ||
          (((iVar68 == 1 && uVar39 == 0) &&
           ((((uVar29 ^ 8) == 0 && uVar55 == 1) && uVar62 == 0) && (uVar59 == 0 && uVar30 == 0))) &&
           iVar71 == 1)))) goto LAB_001f93fd;
      bVar25 = ((((uVar29 ^ 1) == 0 && uVar55 == 4) && uVar62 == 0) && (uVar59 == 0 && uVar30 == 0))
               && uVar39 == 0;
      if (((iVar68 == 1 && bVar25) && iVar71 == 1) || (bVar25 && (iVar68 == 2 && iVar71 == 2)))
      goto LAB_001f93fd;
      convolution_transform_kernel_packed
                (&(this->super_Convolution).weight_data,&this->weight_data_tm,iVar31,uVar7,uVar57,
                 uVar67);
    }
    if (opt->lightmode != true) {
      return 0;
    }
    piVar11 = (this->super_Convolution).weight_data.refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pvVar12 = (this->super_Convolution).weight_data.data;
        pAVar13 = (this->super_Convolution).weight_data.allocator;
        if (pAVar13 == (Allocator *)0x0) {
          if (pvVar12 != (void *)0x0) {
            free(pvVar12);
          }
        }
        else {
          (*pAVar13->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution).weight_data.data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
LAB_001fa6a3:
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
    return 0;
  }
  pMVar10 = (this->super_Convolution).super_Layer.bottom_shapes.
            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((pMVar10 ==
        (this->super_Convolution).super_Layer.bottom_shapes.
        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
        _M_finish) || (pMVar10->w == 0)) || (pMVar10->h == 0)) {
    pMVar40 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar44 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (((pMVar40 != pMVar44) && (pMVar40->w != 0)) && (pMVar40->h != 0)) goto LAB_001f8e7f;
    if ((((int)uVar7 < 0x21) && (opt->use_winograd63_convolution != false)) && (iVar31 < 0x21)) {
LAB_001f8ed5:
      conv3x3s1_winograd63_transform_kernel
                (&(this->super_Convolution).weight_data,&this->weight_winograd63_data,iVar31,uVar7,
                 opt);
      goto LAB_001f9583;
    }
    if (opt->use_winograd43_convolution != true) goto LAB_001f956e;
LAB_001f953c:
    conv3x3s1_winograd43_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd43_data,iVar31,uVar7,opt
              );
  }
  else {
    pMVar40 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar44 = (this->super_Convolution).super_Layer.top_shapes.
              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_finish;
LAB_001f8e7f:
    if (((pMVar40 == pMVar44) || (iVar68 = pMVar40->w, iVar68 == 0)) ||
       (iVar71 = pMVar40->h, iVar71 == 0)) {
      iVar68 = pMVar10->w;
      iVar71 = pMVar10->h;
      uVar50._0_4_ = (this->super_Convolution).pad_left;
      uVar50._4_4_ = (this->super_Convolution).pad_right;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar50;
      auVar74 = vpcmpgtd_avx(auVar75,(undefined1  [16])0x0);
      auVar74 = vpmovsxdq_avx(auVar74);
      if ((((auVar74 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 && -1 < auVar74[0xf])
          && (iVar28 = (this->super_Convolution).pad_top, iVar28 < 1)) &&
         (iVar8 = (this->super_Convolution).pad_bottom, iVar8 < 1)) {
        auVar74 = vpinsrd_avx(auVar75,iVar28,2);
        auVar74 = vpinsrd_avx(auVar74,iVar8,3);
        auVar76._8_4_ = 0xffffff17;
        auVar76._0_8_ = 0xffffff17ffffff17;
        auVar76._12_4_ = 0xffffff17;
        if (auVar74 != auVar76) {
          auVar77._8_4_ = 0xffffff16;
          auVar77._0_8_ = 0xffffff16ffffff16;
          auVar77._12_4_ = 0xffffff16;
          auVar74 = vpcmpeqd_avx(auVar74,auVar77);
          uVar32 = vmovmskps_avx(auVar74);
          if ((char)uVar32 != '\x0f') goto LAB_001f9273;
        }
        goto LAB_001f8ea2;
      }
      iVar68 = iVar68 + uVar50._4_4_ + (undefined4)uVar50;
      iVar71 = iVar71 + (this->super_Convolution).pad_top + (this->super_Convolution).pad_bottom;
    }
    else {
LAB_001f8ea2:
      iVar68 = iVar68 + 2;
      iVar71 = iVar71 + 2;
    }
LAB_001f9273:
    bVar25 = test_prefer_winograd63(iVar31,uVar7,iVar68,iVar71);
    bVar26 = test_prefer_winograd23(iVar31,uVar7,iVar68,iVar71);
    bVar38 = bVar26 & bVar43;
    if (!bVar26) {
      bVar43 = bVar25;
    }
    if (bVar25) {
      bVar27 = opt->use_winograd63_convolution;
      if ((bVar43 & bVar27) != 0) goto LAB_001f9493;
LAB_001f9529:
      if (opt->use_winograd43_convolution == false) {
        if (bVar38 == 0 && opt->use_winograd63_convolution == true) {
          if (bVar27 == 0 && opt->use_winograd63_convolution == false) goto LAB_001f9583;
          goto LAB_001f8ed5;
        }
      }
      else if (bVar38 == 0) goto LAB_001f953c;
    }
    else {
      if (bVar43 == 0) {
        bVar27 = 0;
        goto LAB_001f9529;
      }
LAB_001f9493:
      if (bVar38 == 0) {
        if (!bVar25) goto LAB_001f9583;
        goto LAB_001f8ed5;
      }
    }
LAB_001f956e:
    conv3x3s1_winograd23_transform_kernel
              (&(this->super_Convolution).weight_data,&this->weight_winograd23_data,iVar31,uVar7,opt
              );
  }
LAB_001f9583:
  if (opt->lightmode == true) {
    piVar11 = (this->super_Convolution).weight_data.refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pvVar12 = (this->super_Convolution).weight_data.data;
        pAVar13 = (this->super_Convolution).weight_data.allocator;
        if (pAVar13 == (Allocator *)0x0) {
          if (pvVar12 != (void *)0x0) {
            free(pvVar12);
          }
        }
        else {
          (*pAVar13->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_Convolution).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    (this->super_Convolution).weight_data.data = (void *)0x0;
    (this->super_Convolution).weight_data.refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);
    nT = opt.num_threads;

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer_cpu(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if ((bottom_shapes.empty() || bottom_shapes[0].w == 0 || bottom_shapes[0].h == 0) && (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0))
        {
            // dynamic shape
            if ((opt.use_winograd63_convolution) && (num_input <= 32 && num_output <= 32))
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if (opt.use_winograd43_convolution)
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            int w;
            int h;
            if (top_shapes.empty() || top_shapes[0].w == 0 || top_shapes[0].h == 0)
            {
                w = bottom_shapes[0].w;
                h = bottom_shapes[0].h;

                // make padding
                if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
                {
                    w += pad_left + pad_right;
                    h += pad_top + pad_bottom;
                }
                else if ((pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
                         || (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234))
                {
                    // tensorflow padding=SAME or onnx padding=SAME_UPPER/SAME_LOWER
                    w += 2;
                    h += 2;
                }
            }
            else
            {
                w = top_shapes[0].w + 2;
                h = top_shapes[0].h + 2;
            }

            bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
            bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
            bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

            if (prefer_winograd23 && !opt.use_winograd23_convolution)
            {
                // f23 fallback to f43
                prefer_winograd23 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd63 && !opt.use_winograd63_convolution)
            {
                // f63 fallback to f43
                prefer_winograd63 = false;
                prefer_winograd43 = true;
            }

            if (prefer_winograd43 && !opt.use_winograd43_convolution)
            {
                // f43 fallback to f63 or f23
                prefer_winograd43 = false;
                if (opt.use_winograd63_convolution)
                {
                    prefer_winograd63 = true;
                }
                else
                {
                    prefer_winograd23 = true;
                }
            }

            if (prefer_winograd23)
            {
                conv3x3s1_winograd23_transform_kernel(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
            else if (prefer_winograd43)
            {
                conv3x3s1_winograd43_transform_kernel(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else if (prefer_winograd63)
            {
                conv3x3s1_winograd63_transform_kernel(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                // should never reach here
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        convolution_im2col_gemm_transform_kernel(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    if ((elempack == 16 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 8 && out_elempack == 8 && kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 8 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            || (elempack == 8 && out_elempack == 1 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            || (elempack == 1 && out_elempack == 4 && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2))
    {
        convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
    }
    else
    {
        convolution_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}